

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypergeometric_dist.hpp
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
trng::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,hypergeometric_dist *g)

{
  undefined4 uVar1;
  ostream *out_00;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  
  uVar1 = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = 0x26;
  out_00 = std::operator<<(out,"[hypergeometric ");
  pbVar2 = operator<<(out_00,&g->P);
  std::operator<<(pbVar2,']');
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
  return out;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(std::basic_ostream<char_t, traits_t> &out,
                                                   const hypergeometric_dist &g) {
    std::ios_base::fmtflags flags(out.flags());
    out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
    out << "[hypergeometric " << g.param() << ']';
    out.flags(flags);
    return out;
  }